

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::Release
          (RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *this)

{
  if (this->m_pObject != (SerializedResourceSignatureImpl *)0x0) {
    RefCountedObject<Diligent::IPipelineResourceSignature>::Release
              ((RefCountedObject<Diligent::IPipelineResourceSignature> *)this->m_pObject);
    this->m_pObject = (SerializedResourceSignatureImpl *)0x0;
  }
  return;
}

Assistant:

void Release() noexcept
    {
        if (m_pObject)
        {
            m_pObject->Release();
            m_pObject = nullptr;
        }
    }